

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O3

int cvNlsLSetup(int jbad,int *jcur,void *cvode_mem)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x104,"cvNlsLSetup",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    if (jbad == 0) {
      uVar3 = *(undefined4 *)((long)cvode_mem + 1000);
    }
    else {
      *(undefined4 *)((long)cvode_mem + 1000) = 1;
      uVar3 = 1;
    }
    iVar1 = (**(code **)((long)cvode_mem + 0x3f8))
                      (cvode_mem,uVar3,*(undefined8 *)((long)cvode_mem + 0xd0),
                       *(undefined8 *)((long)cvode_mem + 0xe8),(long)cvode_mem + 0x450,
                       *(undefined8 *)((long)cvode_mem + 0xf0),
                       *(undefined4 *)((long)cvode_mem + 0xf8),
                       *(undefined4 *)((long)cvode_mem + 0x100));
    *(long *)((long)cvode_mem + 0x388) = *(long *)((long)cvode_mem + 0x388) + 1;
    *jcur = *(int *)((long)cvode_mem + 0x450);
    *(undefined8 *)((long)cvode_mem + 0x290) = *(undefined8 *)((long)cvode_mem + 0x288);
    *(undefined8 *)((long)cvode_mem + 0x298) = 0x3ff0000000000000;
    *(undefined8 *)((long)cvode_mem + 0x2a0) = 0x3ff0000000000000;
    *(undefined8 *)((long)cvode_mem + 0x430) = *(undefined8 *)((long)cvode_mem + 0x358);
    if (iVar1 < 0) {
      iVar2 = -6;
    }
    else {
      iVar2 = 0x386;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int cvNlsLSetup(sunbooleantype jbad, sunbooleantype* jcur, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* if the nonlinear solver marked the Jacobian as bad update convfail */
  if (jbad) { cv_mem->convfail = CV_FAIL_BAD_J; }

  /* setup the linear solver */
  retval = cv_mem->cv_lsetup(cv_mem, cv_mem->convfail, cv_mem->cv_y,
                             cv_mem->cv_ftemp, &(cv_mem->cv_jcur),
                             cv_mem->cv_vtemp1, cv_mem->cv_vtemp2,
                             cv_mem->cv_vtemp3);
  cv_mem->cv_nsetups++;

  /* update Jacobian status */
  *jcur = cv_mem->cv_jcur;

  cv_mem->cv_gamrat = ONE;
  cv_mem->cv_gammap = cv_mem->cv_gamma;
  cv_mem->cv_crate  = ONE;
  cv_mem->cv_nstlp  = cv_mem->cv_nst;

  if (retval < 0) { return (CV_LSETUP_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  return (CV_SUCCESS);
}